

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void rec_will(Curl_easy *data,int option)

{
  TELNET *pTVar1;
  TELNET *tn;
  int option_local;
  Curl_easy *data_local;
  
  pTVar1 = (data->req).p.telnet;
  switch(pTVar1->him[option]) {
  case 0:
    if (pTVar1->him_preferred[option] == 1) {
      pTVar1->him[option] = 1;
      send_negotiation(data,0xfd,option);
    }
    else {
      send_negotiation(data,0xfe,option);
    }
    break;
  case 1:
    break;
  case 2:
    if (pTVar1->himq[option] == 0) {
      pTVar1->him[option] = 1;
    }
    else if (pTVar1->himq[option] == 1) {
      pTVar1->him[option] = 3;
      pTVar1->himq[option] = 0;
      send_negotiation(data,0xfe,option);
    }
    break;
  case 3:
    if (pTVar1->himq[option] == 0) {
      pTVar1->him[option] = 0;
    }
    else if (pTVar1->himq[option] == 1) {
      pTVar1->him[option] = 1;
      pTVar1->himq[option] = 0;
    }
  }
  return;
}

Assistant:

static
void rec_will(struct Curl_easy *data, int option)
{
  struct TELNET *tn = data->req.p.telnet;
  switch(tn->him[option]) {
  case CURL_NO:
    if(tn->him_preferred[option] == CURL_YES) {
      tn->him[option] = CURL_YES;
      send_negotiation(data, CURL_DO, option);
    }
    else
      send_negotiation(data, CURL_DONT, option);

    break;

  case CURL_YES:
    /* Already enabled */
    break;

  case CURL_WANTNO:
    switch(tn->himq[option]) {
    case CURL_EMPTY:
      /* Error: DONT answered by WILL */
      tn->him[option] = CURL_NO;
      break;
    case CURL_OPPOSITE:
      /* Error: DONT answered by WILL */
      tn->him[option] = CURL_YES;
      tn->himq[option] = CURL_EMPTY;
      break;
    }
    break;

  case CURL_WANTYES:
    switch(tn->himq[option]) {
    case CURL_EMPTY:
      tn->him[option] = CURL_YES;
      break;
    case CURL_OPPOSITE:
      tn->him[option] = CURL_WANTNO;
      tn->himq[option] = CURL_EMPTY;
      send_negotiation(data, CURL_DONT, option);
      break;
    }
    break;
  }
}